

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool anon_unknown.dwarf_60e82::ProducedNodeTask::isResultValid
               (BuildEngine *engine,Node *node,BuildValue *value)

{
  bool bVar1;
  BuildValue *value_local;
  Node *node_local;
  BuildEngine *engine_local;
  
  bVar1 = llbuild::buildsystem::BuildValue::isFailedInput(value);
  if (bVar1) {
    engine_local._7_1_ = false;
  }
  else {
    bVar1 = llbuild::buildsystem::BuildValue::isMissingInput(value);
    if (bVar1) {
      engine_local._7_1_ = false;
    }
    else {
      engine_local._7_1_ = true;
    }
  }
  return engine_local._7_1_;
}

Assistant:

static bool isResultValid(BuildEngine& engine, Node& node,
                            const BuildValue& value) {
    // If the result was failure, we always need to rebuild (it may produce an
    // error).
    if (value.isFailedInput())
      return false;

    // If the result was previously a missing input, it may have been because
    // we did not previously know how to produce this node. We do now, so
    // attempt to build it now.
    if (value.isMissingInput())
      return false;

    // The produced node result itself doesn't need any synchronization.
    return true;
  }